

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp.c
# Opt level: O0

char * lejp_error_to_string(int e)

{
  int local_14;
  char *pcStack_10;
  int e_local;
  
  if (e < 1) {
    local_14 = -e;
  }
  else {
    local_14 = 0;
  }
  if (local_14 < 0x18) {
    pcStack_10 = parser_errs[local_14];
  }
  else {
    pcStack_10 = "Unknown error";
  }
  return pcStack_10;
}

Assistant:

const char *
lejp_error_to_string(int e)
{
	if (e > 0)
		e = 0;
	else
		e = -e;

	if (e >= (int)LWS_ARRAY_SIZE(parser_errs))
		return "Unknown error";

	return parser_errs[e];
}